

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_CutPrint(Sbd_Sto_t *p,int iObj,Sbd_Cut_t *pCut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int Delay;
  int nDigits;
  int i;
  Sbd_Cut_t *pCut_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  uVar1 = Gia_ManObjNum(p->pGia);
  uVar1 = Abc_Base10Log(uVar1);
  iVar2 = Vec_IntEntry(p->vDelays,iObj);
  if (pCut == (Sbd_Cut_t *)0x0) {
    printf("No cut.\n");
  }
  else {
    printf("%d  {",(ulong)(*(uint *)&pCut->field_0x14 >> 0x1c));
    for (Delay = 0; Delay < (int)(*(uint *)&pCut->field_0x14 >> 0x1c); Delay = Delay + 1) {
      printf(" %*d",(ulong)uVar1,(ulong)(uint)pCut->pLeaves[Delay]);
    }
    for (; Delay < p->nCutSize; Delay = Delay + 1) {
      printf(" %*s",(ulong)uVar1," ");
    }
    printf("  }  Cost = %3d  CostL = %3d  Tree = %d  Slow = %d  Top = %d  ",(ulong)(uint)pCut->Cost,
           (ulong)(uint)pCut->CostLev,(ulong)(*(uint *)&pCut->field_0x14 & 0x1ff),
           (ulong)(*(uint *)&pCut->field_0x14 >> 9 & 0x1ff),
           (ulong)(*(uint *)&pCut->field_0x14 >> 0x12 & 0x3ff));
    uVar4 = 0x20;
    if ((*(uint *)&pCut->field_0x14 >> 9 & 0x1ff) == 0) {
      uVar4 = 0x2a;
    }
    printf("%c ",uVar4);
    for (Delay = 0; Delay < (int)(*(uint *)&pCut->field_0x14 >> 0x1c); Delay = Delay + 1) {
      iVar3 = Vec_IntEntry(p->vDelays,pCut->pLeaves[Delay]);
      printf("%3d ",(ulong)(uint)(iVar3 - iVar2));
    }
    printf("\n");
  }
  return;
}

Assistant:

static inline void Sbd_CutPrint( Sbd_Sto_t * p, int iObj, Sbd_Cut_t * pCut )
{
    int i, nDigits = Abc_Base10Log(Gia_ManObjNum(p->pGia)); 
    int Delay = Vec_IntEntry(p->vDelays, iObj);
    if ( pCut == NULL ) { printf( "No cut.\n" ); return; }
    printf( "%d  {", pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        printf( " %*d", nDigits, pCut->pLeaves[i] );
    for ( ; i < (int)p->nCutSize; i++ )
        printf( " %*s", nDigits, " " );
    printf( "  }  Cost = %3d  CostL = %3d  Tree = %d  Slow = %d  Top = %d  ", 
        pCut->Cost, pCut->CostLev, pCut->nTreeLeaves, pCut->nSlowLeaves, pCut->nTopLeaves );
    printf( "%c ", pCut->nSlowLeaves == 0 ? '*' : ' ' );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        printf( "%3d ", Vec_IntEntry(p->vDelays, pCut->pLeaves[i]) - Delay );
    printf( "\n" );
}